

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintCharAndCodeTo<signed_char>(char c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  uint32_t value;
  int iVar4;
  char *pcVar5;
  undefined7 in_register_00000039;
  String *this;
  char cVar6;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  this = (String *)(ulong)(byte)c;
  iVar4 = (int)CONCAT71(in_register_00000039,c);
  switch(CONCAT71(in_register_00000039,c) & 0xffffffff) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    return;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0014d313_caseD_1:
    cVar6 = 0x5e < (byte)c - 0x20;
    if ((bool)cVar6) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
      lVar2 = *(long *)os;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<((ostream *)os,(uint)(byte)c);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
    }
    else {
      local_40._M_dataplus._M_p._0_1_ = c;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    if (c == '\0') {
      return;
    }
    this = (String *)(ulong)(uint)(int)c;
    goto LAB_0014d3f1;
  case 7:
    pcVar5 = "\\a";
    break;
  case 8:
    pcVar5 = "\\b";
    break;
  case 9:
    pcVar5 = "\\t";
    break;
  case 10:
    pcVar5 = "\\n";
    break;
  case 0xb:
    pcVar5 = "\\v";
    break;
  case 0xc:
    pcVar5 = "\\f";
    break;
  case 0xd:
    pcVar5 = "\\r";
    break;
  default:
    if (iVar4 == 0x27) {
      pcVar5 = "\\\'";
    }
    else {
      if (iVar4 != 0x5c) goto switchD_0014d313_caseD_1;
      pcVar5 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  cVar6 = '\x02';
LAB_0014d3f1:
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  std::ostream::operator<<((ostream *)os,(int)this);
  if (9 < (byte)c && cVar6 != '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
    String::FormatHexUInt32_abi_cxx11_(&local_40,this,value);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p),
               local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}